

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

int fmt::v8::detail::compare(bigint *lhs,bigint *rhs)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  uVar7 = (lhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar8 = (int)uVar7;
  iVar4 = lhs->exp_ + iVar8;
  uVar1 = (uint)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  uVar5 = (ulong)uVar1;
  iVar6 = rhs->exp_ + uVar1;
  if (iVar4 == iVar6) {
    uVar7 = uVar7 & 0xffffffff;
    iVar8 = iVar8 - uVar1;
    iVar4 = 0;
    if (0 < iVar8) {
      iVar4 = iVar8;
    }
    while( true ) {
      iVar8 = (int)uVar7;
      iVar6 = (int)uVar5;
      if (iVar8 <= iVar4) break;
      uVar5 = (ulong)(iVar6 - 1);
      uVar1 = (lhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar7 - 1];
      uVar7 = uVar7 - 1;
      uVar2 = (rhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar5];
      if (uVar1 != uVar2) {
        return (uVar2 < uVar1) - 1 | 1;
      }
    }
    if (iVar6 == iVar8) {
      return 0;
    }
    bVar3 = iVar6 < iVar8;
  }
  else {
    bVar3 = iVar6 < iVar4;
  }
  return (uint)bVar3 * 2 + -1;
}

Assistant:

constexpr auto size() const FMT_NOEXCEPT -> size_t { return size_; }